

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O1

ion_boolean_t
flat_file_predicate_within_bounds(ion_flat_file_t *flat_file,ion_flat_file_row_t *row,va_list *args)

{
  uint uVar1;
  ion_key_t pvVar2;
  ion_key_t pvVar3;
  char cVar4;
  undefined8 *puVar5;
  
  uVar1 = (*args)[0].gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar5 = (undefined8 *)((ulong)uVar1 + (long)(*args)[0].reg_save_area);
    (*args)[0].gp_offset = uVar1 + 8;
  }
  else {
    puVar5 = (undefined8 *)(*args)[0].overflow_arg_area;
    (*args)[0].overflow_arg_area = puVar5 + 1;
  }
  pvVar2 = (ion_key_t)*puVar5;
  uVar1 = (*args)[0].gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar5 = (undefined8 *)((ulong)uVar1 + (long)(*args)[0].reg_save_area);
    (*args)[0].gp_offset = uVar1 + 8;
  }
  else {
    puVar5 = (undefined8 *)(*args)[0].overflow_arg_area;
    (*args)[0].overflow_arg_area = puVar5 + 1;
  }
  if (row->row_status == '\x01') {
    pvVar3 = (ion_key_t)*puVar5;
    cVar4 = (*(flat_file->super).compare)(row->key,pvVar2,(flat_file->super).record.key_size);
    if (-1 < cVar4) {
      cVar4 = (*(flat_file->super).compare)(row->key,pvVar3,(flat_file->super).record.key_size);
      return cVar4 < '\x01';
    }
  }
  return '\0';
}

Assistant:

ion_boolean_t
flat_file_predicate_within_bounds(
	ion_flat_file_t		*flat_file,
	ion_flat_file_row_t *row,
	va_list				*args
) {
	ion_key_t	lower_bound = va_arg(*args, ion_key_t);
	ion_key_t	upper_bound = va_arg(*args, ion_key_t);

	return ION_FLAT_FILE_STATUS_OCCUPIED == row->row_status && flat_file->super.compare(row->key, lower_bound, flat_file->super.record.key_size) >= 0 && flat_file->super.compare(row->key, upper_bound, flat_file->super.record.key_size) <= 0;
}